

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

AMQP_VALUE amqpvalue_get_composite_item(AMQP_VALUE value,size_t index)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  AMQP_VALUE result;
  size_t index_local;
  AMQP_VALUE value_local;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_composite_item",0x1cad,1,"NULL value");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if ((value->type == AMQP_TYPE_COMPOSITE) || (value->type == AMQP_TYPE_DESCRIBED)) {
    l = (LOGGER_LOG)amqpvalue_get_list_item((value->value).described_value.value,index);
    if (((AMQP_VALUE)l == (AMQP_VALUE)0x0) &&
       (p_Var1 = xlogging_get_log_function(), p_Var1 != (LOGGER_LOG)0x0)) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_composite_item",0x1cbe,1,
                "amqpvalue_get_list_item failed for composite item");
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_composite_item",0x1cb6,1,
                "Attempt to get composite item on a non-composite type");
    }
    l = (LOGGER_LOG)0x0;
  }
  return (AMQP_VALUE)l;
}

Assistant:

AMQP_VALUE amqpvalue_get_composite_item(AMQP_VALUE value, size_t index)
{
    AMQP_VALUE result;

    if (value == NULL)
    {
        LogError("NULL value");
        result = NULL;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if ((value_data->type != AMQP_TYPE_COMPOSITE) &&
            (value_data->type != AMQP_TYPE_DESCRIBED))
        {
            LogError("Attempt to get composite item on a non-composite type");
            result = NULL;
        }
        else
        {
            result = amqpvalue_get_list_item(value_data->value.described_value.value, index);
            if (result == NULL)
            {
                LogError("amqpvalue_get_list_item failed for composite item");
            }
        }
    }

    return result;
}